

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall parser::Parser::expand(Parser *this)

{
  _Elt_pointer ppVar1;
  TokenType TVar2;
  Operator e;
  PRECENDENCE local_104;
  stack<std::pair<int,_Operator>,_std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>_>
  *local_100;
  string local_f8;
  undefined1 local_d8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Operator local_80;
  
  local_104 = BASE;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  Operator::Operator(&local_80,NULLTOKEN,&local_f8);
  std::pair<int,_Operator>::pair<ast::PRECENDENCE,_Operator,_true>
            ((pair<int,_Operator> *)local_d8,&local_104,&local_80);
  local_100 = &this->Operators;
  std::deque<std::pair<int,Operator>,std::allocator<std::pair<int,Operator>>>::
  emplace_back<std::pair<int,Operator>>
            ((deque<std::pair<int,Operator>,std::allocator<std::pair<int,Operator>>> *)local_100,
             (pair<int,_Operator> *)local_d8);
  Operator::~Operator((Operator *)(local_d8 + 8));
  Operator::~Operator(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  produce(this);
  binary((Operator *)local_d8,this,(this->peekToken).Type);
  if (local_d8._8_4_ != ERROR) {
    do {
      nextToken(this);
      pushOperator(this,(Operator *)local_d8,true);
      nextToken(this);
      produce(this);
      binary(&local_80,this,(this->peekToken).Type);
      local_d8._8_4_ = local_80.super_Token.Type;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d8 + 0x10),&local_80.super_Token.Literal);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_a8,&local_80.symbol);
      Operator::~Operator(&local_80);
    } while (local_d8._8_4_ != ERROR);
  }
  while( true ) {
    ppVar1 = (this->Operators).c.
             super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar1 == (this->Operators).c.
                  super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      TVar2 = (this->Operators).c.
              super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][4].second.super_Token.Type;
    }
    else {
      TVar2 = ppVar1[-1].second.super_Token.Type;
    }
    if ((TVar2 == ERROR) || (TVar2 == NULLTOKEN)) break;
    popOperator(this,true);
  }
  std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>::pop_back
            (&local_100->c);
  Operator::~Operator((Operator *)local_d8);
  return;
}

Assistant:

void Parser::expand()
{
    Operators.push({PRECENDENCE::BASE, Operator(TokenType::NULLTOKEN, "")});
    produce();
    auto e = binary(peekToken.Type);
    while(e.Type != TokenType::ERROR)
    {
        nextToken();
        pushOperator(e, true);
        nextToken();
        produce();
        e = binary(peekToken.Type);
    }
    while(Operators.top().second.Type != TokenType::ERROR &&
          Operators.top().second.Type != TokenType::NULLTOKEN)
    {
        popOperator(true);
    }
    Operators.pop();

}